

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::isOrHasName(QPDFObjectHandle *this,string *value)

{
  bool bVar1;
  reference this_00;
  QPDFObjectHandle *item;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_50;
  iterator __end3;
  iterator __begin3;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range3;
  string *value_local;
  QPDFObjectHandle *this_local;
  
  bVar1 = isNameAndEquals(this,value);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    bVar1 = isArray(this);
    if (bVar1) {
      getArrayAsVector((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin3,this
                      );
      __end3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                         ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin3);
      local_50._M_current =
           (QPDFObjectHandle *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin3);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&local_50), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                  ::operator*(&__end3);
        bVar1 = isNameAndEquals(this_00,value);
        if (bVar1) {
          this_local._7_1_ = 1;
          item._4_4_ = 1;
          goto LAB_002c18e7;
        }
        __gnu_cxx::
        __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
        ::operator++(&__end3);
      }
      item._4_4_ = 2;
LAB_002c18e7:
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin3);
      if (item._4_4_ == 1) goto LAB_002c1902;
    }
    this_local._7_1_ = 0;
  }
LAB_002c1902:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDFObjectHandle::isOrHasName(std::string const& value) const
{
    if (isNameAndEquals(value)) {
        return true;
    } else if (isArray()) {
        for (auto& item: getArrayAsVector()) {
            if (item.isNameAndEquals(value)) {
                return true;
            }
        }
    }
    return false;
}